

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGenCof.c
# Opt level: O3

DdNode * cuddAddConstrainRecur(DdManager *dd,DdNode *f,DdNode *c)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  DdNode *pDVar5;
  DdNode *f_00;
  DdNode *pDVar6;
  DdNode *c_00;
  ulong uVar7;
  uint index;
  DdNode *c_01;
  
  while( true ) {
    pDVar6 = dd->one;
    if (pDVar6 == c) {
      return f;
    }
    if (dd->zero == c) {
      return dd->zero;
    }
    if (*(int *)((ulong)f & 0xfffffffffffffffe) == 0x7fffffff) {
      return f;
    }
    if (f == c) {
      return pDVar6;
    }
    pDVar5 = cuddCacheLookup2(dd,Cudd_addConstrain,f,c);
    if (pDVar5 != (DdNode *)0x0) {
      return pDVar5;
    }
    uVar2 = dd->perm[f->index];
    uVar3 = dd->perm[c->index];
    pDVar5 = f;
    f_00 = f;
    index = c->index;
    if (uVar2 <= uVar3) {
      pDVar5 = (f->type).kids.T;
      f_00 = (f->type).kids.E;
      index = f->index;
    }
    c_00 = c;
    c_01 = c;
    if (uVar3 <= uVar2) {
      c_00 = (c->type).kids.T;
      c_01 = (c->type).kids.E;
    }
    if (*(int *)((ulong)c_00 & 0xfffffffffffffffe) != 0x7fffffff) break;
    if (c_00 == pDVar6) goto LAB_00785d54;
    f = f_00;
    c = c_01;
    if (c_01 == pDVar6) {
      return f_00;
    }
  }
  pDVar5 = cuddAddConstrainRecur(dd,pDVar5,c_00);
  if (pDVar5 == (DdNode *)0x0) {
    return (DdNode *)0x0;
  }
LAB_00785d54:
  uVar7 = (ulong)pDVar5 & 0xfffffffffffffffe;
  iVar4 = *(int *)(uVar7 + 4);
  *(int *)(uVar7 + 4) = iVar4 + 1;
  if (*(int *)((ulong)c_01 & 0xfffffffffffffffe) == 0x7fffffff) {
    if (c_01 != pDVar6) {
      *(int *)(uVar7 + 4) = iVar4;
      return pDVar5;
    }
  }
  else {
    f_00 = cuddAddConstrainRecur(dd,f_00,c_01);
    if (f_00 == (DdNode *)0x0) goto LAB_00785e22;
  }
  piVar1 = (int *)(((ulong)f_00 & 0xfffffffffffffffe) + 4);
  *piVar1 = *piVar1 + 1;
  pDVar6 = pDVar5;
  if (pDVar5 != f_00) {
    pDVar6 = cuddUniqueInter(dd,index,pDVar5,f_00);
  }
  if (pDVar6 != (DdNode *)0x0) {
    *(int *)(uVar7 + 4) = *(int *)(uVar7 + 4) + -1;
    piVar1 = (int *)(((ulong)f_00 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + -1;
    cuddCacheInsert2(dd,Cudd_addConstrain,f,c,pDVar6);
    return pDVar6;
  }
  Cudd_RecursiveDeref(dd,f_00);
LAB_00785e22:
  Cudd_RecursiveDeref(dd,pDVar5);
  return (DdNode *)0x0;
}

Assistant:

DdNode *
cuddAddConstrainRecur(
  DdManager * dd,
  DdNode * f,
  DdNode * c)
{
    DdNode       *Fv, *Fnv, *Cv, *Cnv, *t, *e, *r;
    DdNode       *one, *zero;
    unsigned int topf, topc;
    int          index;

    statLine(dd);
    one = DD_ONE(dd);
    zero = DD_ZERO(dd);

    /* Trivial cases. */
    if (c == one)               return(f);
    if (c == zero)              return(zero);
    if (Cudd_IsConstant(f))     return(f);
    if (f == c)                 return(one);

    /* Now f and c are non-constant. */

    /* Check the cache. */
    r = cuddCacheLookup2(dd, Cudd_addConstrain, f, c);
    if (r != NULL) {
        return(r);
    }
    
    /* Recursive step. */
    topf = dd->perm[f->index];
    topc = dd->perm[c->index];
    if (topf <= topc) {
        index = f->index;
        Fv = cuddT(f); Fnv = cuddE(f);
    } else {
        index = c->index;
        Fv = Fnv = f;
    }
    if (topc <= topf) {
        Cv = cuddT(c); Cnv = cuddE(c);
    } else {
        Cv = Cnv = c;
    }

    if (!Cudd_IsConstant(Cv)) {
        t = cuddAddConstrainRecur(dd, Fv, Cv);
        if (t == NULL)
            return(NULL);
    } else if (Cv == one) {
        t = Fv;
    } else {            /* Cv == zero: return Fnv @ Cnv */
        if (Cnv == one) {
            r = Fnv;
        } else {
            r = cuddAddConstrainRecur(dd, Fnv, Cnv);
            if (r == NULL)
                return(NULL);
        }
        return(r);
    }
    cuddRef(t);

    if (!Cudd_IsConstant(Cnv)) {
        e = cuddAddConstrainRecur(dd, Fnv, Cnv);
        if (e == NULL) {
            Cudd_RecursiveDeref(dd, t);
            return(NULL);
        }
    } else if (Cnv == one) {
        e = Fnv;
    } else {            /* Cnv == zero: return Fv @ Cv previously computed */
        cuddDeref(t);
        return(t);
    }
    cuddRef(e);

    r = (t == e) ? t : cuddUniqueInter(dd, index, t, e);
    if (r == NULL) {
        Cudd_RecursiveDeref(dd, e);
        Cudd_RecursiveDeref(dd, t);
        return(NULL);
    }
    cuddDeref(t);
    cuddDeref(e);

    cuddCacheInsert2(dd, Cudd_addConstrain, f, c, r);
    return(r);

}